

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

void __thiscall Generator::registerClassInfoStrings(Generator *this)

{
  long lVar1;
  ClassInfoDef *c;
  ClassInfoDef *s;
  ClassInfoDef *pCVar2;
  
  lVar1 = (this->cdef->super_BaseDef).classInfoList.d.size;
  if (lVar1 != 0) {
    s = (this->cdef->super_BaseDef).classInfoList.d.ptr;
    pCVar2 = s + lVar1;
    do {
      strreg(this,&s->name);
      strreg(this,&s->value);
      s = s + 1;
    } while (s != pCVar2);
  }
  return;
}

Assistant:

void Generator::registerClassInfoStrings()
{
    for (const ClassInfoDef &c : std::as_const(cdef->classInfoList)) {
        strreg(c.name);
        strreg(c.value);
    }
}